

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_dstr_reset(arg_dstr_t ds)

{
  arg_dstr_free(ds);
  if ((ds->append_data != (char *)0x0) && (0 < ds->append_data_size)) {
    free(ds->append_data);
    ds->append_data = (char *)0x0;
    ds->append_data_size = 0;
  }
  ds->data = ds->sbuf;
  ds->sbuf[0] = '\0';
  return;
}

Assistant:

void arg_dstr_reset(arg_dstr_t ds) {
    arg_dstr_free(ds);
    if ((ds->append_data != NULL) && (ds->append_data_size > 0)) {
        xfree(ds->append_data);
        ds->append_data = NULL;
        ds->append_data_size = 0;
    }

    ds->data = ds->sbuf;
    ds->sbuf[0] = 0;
}